

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infinite_suite.cpp
# Opt level: O2

void api_suite::test_empty(void)

{
  value_type local_c0 [1];
  value_type local_b8 [1];
  infinite<double> filter;
  
  local_b8[0] = 1.0;
  local_c0[0] = 1.0;
  trial::online::impulse::infinite<double>::infinite<1ul,1ul>(&filter,&local_b8,&local_c0,1.0);
  boost::detail::test_impl
            ("filter.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/impulse/infinite_suite.cpp"
             ,0x1a,"void api_suite::test_empty()",
             filter.input.window.super_span<double,_18446744073709551615UL>.member.size == 0);
  trial::online::impulse::infinite<double>::push(&filter,1.0);
  boost::detail::test_impl
            ("!filter.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/impulse/infinite_suite.cpp"
             ,0x1c,"void api_suite::test_empty()",
             filter.input.window.super_span<double,_18446744073709551615UL>.member.size != 0);
  trial::online::impulse::infinite<double>::~infinite(&filter);
  return;
}

Assistant:

void test_empty()
{
    impulse::infinite<double> filter({1.0}, {1.0});
    TRIAL_TEST(filter.empty());
    filter.push(1);
    TRIAL_TEST(!filter.empty());
}